

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

EntityExpRes __thiscall
xercesc_4_0::DGXMLScanner::scanEntityRef
          (DGXMLScanner *this,bool inAttVal,XMLCh *firstCh,XMLCh *secondCh,bool *escaped)

{
  DTDGrammar *this_00;
  XMLValidator *this_01;
  XMLDocumentHandler *pXVar1;
  XMLBufferMgr *pXVar2;
  bool bVar3;
  uint uVar4;
  XMLBuffer *pXVar5;
  XMLCh *pXVar6;
  XMLBufferMgr *pXVar7;
  XMLCh *pubId;
  RuntimeException *this_02;
  XMLCh *pXVar8;
  XMLSize_t dataLen;
  XMLReader *pXVar9;
  ulong uVar10;
  XMLCh *local_210;
  bool local_13a;
  XMLCh local_118 [4];
  XMLCh expLimStr_1 [32];
  XMLReader *valueReader;
  XMLCh expLimStr [32];
  Janitor<xercesc_4_0::InputSource> janSrc;
  XMLReader *reader;
  InputSource *srcUsed;
  XMLEntityDecl *decl;
  bool local_55;
  int local_54;
  undefined1 local_50 [3];
  bool validName;
  int colonPosition;
  XMLBufBid bbName;
  XMLSize_t curReader;
  bool *escaped_local;
  XMLCh *secondCh_local;
  XMLCh *firstCh_local;
  bool inAttVal_local;
  DGXMLScanner *this_local;
  
  *secondCh = L'\0';
  *escaped = false;
  bbName.fMgr = (XMLBufferMgr *)ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr)
  ;
  bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'#');
  if (bVar3) {
    bVar3 = XMLScanner::scanCharRef(&this->super_XMLScanner,firstCh,secondCh);
    pXVar2 = bbName.fMgr;
    if (!bVar3) {
      return EntityExp_Failed;
    }
    *escaped = true;
    pXVar7 = (XMLBufferMgr *)ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
    if (pXVar2 != pXVar7) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    }
    return EntityExp_Returned;
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_50,&(this->super_XMLScanner).fBufMgr);
  if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
    pXVar5 = XMLBufBid::getBuffer((XMLBufBid *)local_50);
    local_13a = ReaderMgr::getName(&(this->super_XMLScanner).fReaderMgr,pXVar5);
  }
  else {
    pXVar5 = XMLBufBid::getBuffer((XMLBufBid *)local_50);
    local_13a = ReaderMgr::getQName(&(this->super_XMLScanner).fReaderMgr,pXVar5,&local_54);
  }
  local_55 = local_13a;
  if (local_13a == false) {
    bVar3 = XMLBufBid::isEmpty((XMLBufBid *)local_50);
    if (bVar3) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedEntityRefName);
    }
    else {
      pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidEntityRefName,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    this_local._4_4_ = EntityExp_Failed;
    decl._0_4_ = 1;
  }
  else {
    bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L';');
    if (!bVar3) {
      pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedEntityRef,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    pXVar2 = bbName.fMgr;
    pXVar7 = (XMLBufferMgr *)ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
    if (pXVar2 != pXVar7) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    }
    this_00 = this->fDTDGrammar;
    pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
    srcUsed = (InputSource *)DTDGrammar::getEntityDecl(this_00,pXVar6);
    if ((DTDEntityDecl *)srcUsed == (DTDEntityDecl *)0x0) {
      if ((((this->super_XMLScanner).fStandalone & 1U) == 0) &&
         (((this->super_XMLScanner).fHasNoDTD & 1U) == 0)) {
        if (((this->super_XMLScanner).fValidate & 1U) != 0) {
          this_01 = (this->super_XMLScanner).fValidator;
          pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
          XMLValidator::emitError
                    (this_01,VC_EntityNotFound,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else {
        pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
        XMLScanner::emitError
                  (&this->super_XMLScanner,EntityNotFound,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      this_local._4_4_ = EntityExp_Failed;
      decl._0_4_ = 1;
    }
    else {
      if ((((this->super_XMLScanner).fStandalone & 1U) != 0) &&
         (uVar4 = (*(((DTDEntityDecl *)srcUsed)->super_XMLEntityDecl).super_XSerializable.
                    _vptr_XSerializable[5])(), (uVar4 & 1) == 0)) {
        pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
        XMLScanner::emitError
                  (&this->super_XMLScanner,IllegalRefInStandalone,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      bVar3 = XMLEntityDecl::isExternal((XMLEntityDecl *)srcUsed);
      if (bVar3) {
        bVar3 = XMLEntityDecl::isUnparsed((XMLEntityDecl *)srcUsed);
        if (bVar3) {
          pXVar6 = XMLBufBid::getRawBuffer((XMLBufBid *)local_50);
          XMLScanner::emitError
                    (&this->super_XMLScanner,NoUnparsedEntityRefs,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          this_local._4_4_ = EntityExp_Failed;
          decl._0_4_ = 1;
          goto LAB_003468d0;
        }
        if (inAttVal) {
          XMLScanner::emitError(&this->super_XMLScanner,NoExtRefsInAttValue);
        }
        pXVar6 = XMLEntityDecl::getBaseURI((XMLEntityDecl *)srcUsed);
        pXVar8 = XMLEntityDecl::getSystemId((XMLEntityDecl *)srcUsed);
        pubId = XMLEntityDecl::getPublicId((XMLEntityDecl *)srcUsed);
        pXVar9 = ReaderMgr::createReader
                           (&(this->super_XMLScanner).fReaderMgr,pXVar6,pXVar8,pubId,false,
                            RefFrom_NonLiteral,Type_General,Source_External,(InputSource **)&reader,
                            (bool)((this->super_XMLScanner).fCalculateSrcOfs & 1),
                            (this->super_XMLScanner).fLowWaterMark,
                            (bool)((this->super_XMLScanner).fDisableDefaultEntityResolution & 1));
        Janitor<xercesc_4_0::InputSource>::Janitor
                  ((Janitor<xercesc_4_0::InputSource> *)(expLimStr + 0x1c),(InputSource *)reader);
        if (pXVar9 == (XMLReader *)0x0) {
          this_02 = (RuntimeException *)__cxa_allocate_exception(0x30);
          if (reader == (XMLReader *)0x0) {
            local_210 = XMLEntityDecl::getSystemId((XMLEntityDecl *)srcUsed);
          }
          else {
            local_210 = (XMLCh *)(**(code **)(reader->fCharIndex + 0x28))();
          }
          RuntimeException::RuntimeException
                    (this_02,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                     ,0xd96,Gen_CouldNotOpenExtEntity,local_210,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(this_02,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
        }
        bVar3 = ReaderMgr::pushReader
                          (&(this->super_XMLScanner).fReaderMgr,pXVar9,(XMLEntityDecl *)srcUsed);
        if (bVar3) {
          if (((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) &&
             (uVar10 = (this->super_XMLScanner).fEntityExpansionCount + 1,
             (this->super_XMLScanner).fEntityExpansionCount = uVar10,
             (this->super_XMLScanner).fEntityExpansionLimit < uVar10)) {
            XMLString::sizeToText
                      ((this->super_XMLScanner).fEntityExpansionLimit,(XMLCh *)&valueReader,0x1f,10,
                       (this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,EntityExpansionLimitExceeded,(XMLCh *)&valueReader,
                       (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            (this->super_XMLScanner).fEntityExpansionCount = 0;
          }
          if (((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) && (!inAttVal)) {
            pXVar1 = (this->super_XMLScanner).fDocHandler;
            (*pXVar1->_vptr_XMLDocumentHandler[0xc])(pXVar1,srcUsed);
          }
          bVar3 = XMLScanner::checkXMLDecl(&this->super_XMLScanner,true);
          if (bVar3) {
            XMLScanner::scanXMLDecl(&this->super_XMLScanner,Decl_Text);
          }
          decl._0_4_ = 0;
        }
        else {
          pXVar6 = XMLEntityDecl::getName((XMLEntityDecl *)srcUsed);
          XMLScanner::emitError
                    (&this->super_XMLScanner,RecursiveEntity,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          this_local._4_4_ = EntityExp_Failed;
          decl._0_4_ = 1;
        }
        Janitor<xercesc_4_0::InputSource>::~Janitor
                  ((Janitor<xercesc_4_0::InputSource> *)(expLimStr + 0x1c));
        if ((int)decl != 0) goto LAB_003468d0;
      }
      else {
        uVar4 = (*srcUsed->_vptr_InputSource[7])();
        if ((uVar4 & 1) != 0) {
          pXVar6 = XMLEntityDecl::getValue((XMLEntityDecl *)srcUsed);
          *firstCh = *pXVar6;
          *escaped = true;
          this_local._4_4_ = EntityExp_Returned;
          decl._0_4_ = 1;
          goto LAB_003468d0;
        }
        pXVar6 = XMLEntityDecl::getName((XMLEntityDecl *)srcUsed);
        pXVar8 = XMLEntityDecl::getValue((XMLEntityDecl *)srcUsed);
        dataLen = XMLEntityDecl::getValueLen((XMLEntityDecl *)srcUsed);
        pXVar9 = ReaderMgr::createIntEntReader
                           (&(this->super_XMLScanner).fReaderMgr,pXVar6,RefFrom_NonLiteral,
                            Type_General,pXVar8,dataLen,false,true,100);
        bVar3 = ReaderMgr::pushReader
                          (&(this->super_XMLScanner).fReaderMgr,pXVar9,(XMLEntityDecl *)srcUsed);
        if (!bVar3) {
          pXVar6 = XMLEntityDecl::getName((XMLEntityDecl *)srcUsed);
          XMLScanner::emitError
                    (&this->super_XMLScanner,RecursiveEntity,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
        if (((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) &&
           (uVar10 = (this->super_XMLScanner).fEntityExpansionCount + 1,
           (this->super_XMLScanner).fEntityExpansionCount = uVar10,
           (this->super_XMLScanner).fEntityExpansionLimit < uVar10)) {
          XMLString::sizeToText
                    ((this->super_XMLScanner).fEntityExpansionLimit,local_118,0x1f,10,
                     (this->super_XMLScanner).fMemoryManager);
          XMLScanner::emitError
                    (&this->super_XMLScanner,EntityExpansionLimitExceeded,local_118,(XMLCh *)0x0,
                     (XMLCh *)0x0,(XMLCh *)0x0);
        }
        if (((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) && (!inAttVal)) {
          pXVar1 = (this->super_XMLScanner).fDocHandler;
          (*pXVar1->_vptr_XMLDocumentHandler[0xc])(pXVar1,srcUsed);
        }
        bVar3 = XMLScanner::checkXMLDecl(&this->super_XMLScanner,true);
        if (bVar3) {
          XMLScanner::emitError(&this->super_XMLScanner,TextDeclNotLegalHere);
          ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
        }
      }
      this_local._4_4_ = EntityExp_Pushed;
      decl._0_4_ = 1;
    }
  }
LAB_003468d0:
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_50);
  return this_local._4_4_;
}

Assistant:

DGXMLScanner::EntityExpRes
DGXMLScanner::scanEntityRef(  const   bool    inAttVal
                            ,       XMLCh&  firstCh
                            ,       XMLCh&  secondCh
                            ,       bool&   escaped)
{
    // Assume no escape
    secondCh = 0;
    escaped = false;

    // We have to insure that its all in one entity
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  If the next char is a pound, then its a character reference and we
    //  need to expand it always.
    if (fReaderMgr.skippedChar(chPound))
    {
        //  Its a character reference, so scan it and get back the numeric
        //  value it represents.
        if (!scanCharRef(firstCh, secondCh))
            return EntityExp_Failed;

        escaped = true;

        if (curReader != fReaderMgr.getCurrentReaderNum())
            emitError(XMLErrs::PartialMarkupInEntity);

        return EntityExp_Returned;
    }

    // Expand it since its a normal entity ref
    XMLBufBid bbName(&fBufMgr);

    int  colonPosition;
    bool validName = fDoNamespaces ? fReaderMgr.getQName(bbName.getBuffer(), &colonPosition) :
                                     fReaderMgr.getName(bbName.getBuffer());
    if (!validName)
    {
        if (bbName.isEmpty())
            emitError(XMLErrs::ExpectedEntityRefName);
        else
            emitError(XMLErrs::InvalidEntityRefName, bbName.getRawBuffer());
        return EntityExp_Failed;
    }

    //  Next char must be a semi-colon. But if its not, just emit
    //  an error and try to continue.
    if (!fReaderMgr.skippedChar(chSemiColon))
        emitError(XMLErrs::UnterminatedEntityRef, bbName.getRawBuffer());

    // Make sure we ended up on the same entity reader as the & char
    if (curReader != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialMarkupInEntity);

    // Look up the name in the general entity pool
    XMLEntityDecl* decl = fDTDGrammar->getEntityDecl(bbName.getRawBuffer());

    // If it does not exist, then obviously an error
    if (!decl)
    {
        // XML 1.0 Section 4.1
        // Well-formedness Constraint for entity not found:
        //   In a document without any DTD, a document with only an internal DTD subset which contains no parameter entity references,
        //      or a document with "standalone='yes'", for an entity reference that does not occur within the external subset
        //      or a parameter entity
        //
        // Else it's Validity Constraint
        if (fStandalone || fHasNoDTD)
            emitError(XMLErrs::EntityNotFound, bbName.getRawBuffer());
        else {
            if (fValidate)
                fValidator->emitError(XMLValid::VC_EntityNotFound, bbName.getRawBuffer());
        }

        return EntityExp_Failed;
    }

    // XML 1.0 Section 4.1
    //  If we are a standalone document, then it has to have been declared
    //  in the internal subset.
    if (fStandalone && !decl->getDeclaredInIntSubset())
        emitError(XMLErrs::IllegalRefInStandalone, bbName.getRawBuffer());

    if (decl->isExternal())
    {
        // If its unparsed, then its not valid here
        if (decl->isUnparsed())
        {
            emitError(XMLErrs::NoUnparsedEntityRefs, bbName.getRawBuffer());
            return EntityExp_Failed;
        }

        // If we are in an attribute value, then not valid but keep going
        if (inAttVal)
            emitError(XMLErrs::NoExtRefsInAttValue);

        // And now create a reader to read this entity
        InputSource* srcUsed;
        XMLReader* reader = fReaderMgr.createReader
        (
            decl->getBaseURI()
            , decl->getSystemId()
            , decl->getPublicId()
            , false
            , XMLReader::RefFrom_NonLiteral
            , XMLReader::Type_General
            , XMLReader::Source_External
            , srcUsed
            , fCalculateSrcOfs
            , fLowWaterMark
            , fDisableDefaultEntityResolution
        );

        // Put a janitor on the source so it gets cleaned up on exit
        Janitor<InputSource> janSrc(srcUsed);

        //  If the creation failed, and its not because the source was empty,
        //  then emit an error and return.
        if (!reader)
            ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Gen_CouldNotOpenExtEntity, srcUsed ? srcUsed->getSystemId() : decl->getSystemId(), fMemoryManager);

        //  Push the reader. If its a recursive expansion, then emit an error
        //  and return an failure.
        if (!fReaderMgr.pushReader(reader, decl))
        {
            emitError(XMLErrs::RecursiveEntity, decl->getName());
            return EntityExp_Failed;
        }

        // here's where we need to check if there's a SecurityManager,
        // how many entity references we've had
        if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
            XMLCh expLimStr[32];
            XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
            emitError
            (
                XMLErrs::EntityExpansionLimitExceeded
                , expLimStr
            );
            // there seems nothing better to do than reset the entity expansion counter
            fEntityExpansionCount = 0;
        }

        //  Do a start entity reference event.
        //
        //  <TBD> For now, we supress them in att values. Later, when
        //  the stuff is in place to correctly allow DOM to handle them
        //  we'll turn this back on.
        if (fDocHandler && !inAttVal)
            fDocHandler->startEntityReference(*decl);

        // If it starts with the XML string, then parse a text decl
        if (checkXMLDecl(true))
            scanXMLDecl(Decl_Text);
    }
    else
    {
        //  If its one of the special char references, then we can return
        //  it as a character, and its considered escaped.
        if (decl->getIsSpecialChar())
        {
            firstCh = decl->getValue()[0];
            escaped = true;
            return EntityExp_Returned;
        }

        //  Create a reader over a memory stream over the entity value
        //  We force it to assume UTF-16 by passing in an encoding
        //  string. This way it won't both trying to predecode the
        //  first line, looking for an XML/TextDecl.
        XMLReader* valueReader = fReaderMgr.createIntEntReader
        (
            decl->getName()
            , XMLReader::RefFrom_NonLiteral
            , XMLReader::Type_General
            , decl->getValue()
            , decl->getValueLen()
            , false
        );

        //  Try to push the entity reader onto the reader manager stack,
        //  where it will become the subsequent input. If it fails, that
        //  means the entity is recursive, so issue an error. The reader
        //  will have just been discarded, but we just keep going.
        if (!fReaderMgr.pushReader(valueReader, decl))
            emitError(XMLErrs::RecursiveEntity, decl->getName());

        // here's where we need to check if there's a SecurityManager,
        // how many entity references we've had
        if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
            XMLCh expLimStr[32];
            XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
            emitError
            (
                XMLErrs::EntityExpansionLimitExceeded
                , expLimStr
            );
        }

        //  Do a start entity reference event.
        //
        //  <TBD> For now, we supress them in att values. Later, when
        //  the stuff is in place to correctly allow DOM to handle them
        //  we'll turn this back on.
        if (fDocHandler && !inAttVal)
            fDocHandler->startEntityReference(*decl);

        // If it starts with the XML string, then it's an error
        if (checkXMLDecl(true)) {
            emitError(XMLErrs::TextDeclNotLegalHere);
            fReaderMgr.skipPastChar(chCloseAngle);
        }
    }
    return EntityExp_Pushed;
}